

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int propagateConstantExprRewrite(Walker *pWalker,Expr *pExpr)

{
  WhereConst *pWVar1;
  Expr *pEVar2;
  Expr *pColumn;
  WhereConst *pConst;
  int i;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (pExpr->op == 0xa2) {
    if ((pExpr->flags & 8) == 0) {
      pWVar1 = (pWalker->u).pConst;
      for (pConst._4_4_ = 0; pConst._4_4_ < pWVar1->nConst; pConst._4_4_ = pConst._4_4_ + 1) {
        pEVar2 = pWVar1->apExpr[pConst._4_4_ << 1];
        if (((pEVar2 != pExpr) && (pEVar2->iTable == pExpr->iTable)) &&
           (pEVar2->iColumn == pExpr->iColumn)) {
          pWVar1->nChng = pWVar1->nChng + 1;
          pExpr->flags = pExpr->flags & 0xff7fffff;
          pExpr->flags = pExpr->flags | 8;
          pEVar2 = sqlite3ExprDup(pWVar1->pParse->db,pWVar1->apExpr[pConst._4_4_ * 2 + 1],0);
          pExpr->pLeft = pEVar2;
          break;
        }
      }
      pWalker_local._4_4_ = 1;
    }
    else {
      pWalker_local._4_4_ = 0;
    }
  }
  else {
    pWalker_local._4_4_ = 0;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int propagateConstantExprRewrite(Walker *pWalker, Expr *pExpr){
  int i;
  WhereConst *pConst;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol) ) return WRC_Continue;
  pConst = pWalker->u.pConst;
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    break;
  }
  return WRC_Prune;
}